

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O1

void __thiscall xmrig::Miner::printHashrate(Miner *this,bool details)

{
  pointer ppIVar1;
  IBackend *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  pointer ppIVar8;
  double dVar9;
  char num [32];
  double local_70;
  double local_68;
  double local_60;
  char local_58 [40];
  Hashrate *this_00;
  
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  ppIVar8 = (this->d_ptr->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar1 = (this->d_ptr->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar8 == ppIVar1) {
    local_60 = 0.0;
    local_68 = 0.0;
    local_70 = 0.0;
  }
  else {
    local_70 = 0.0;
    local_68 = 0.0;
    local_60 = 0.0;
    do {
      pIVar2 = *ppIVar8;
      iVar3 = (*pIVar2->_vptr_IBackend[4])(pIVar2);
      this_00 = (Hashrate *)CONCAT44(extraout_var,iVar3);
      if (this_00 != (Hashrate *)0x0) {
        dVar9 = Hashrate::calc(this_00,10000);
        local_70 = local_70 + dVar9;
        dVar9 = Hashrate::calc(this_00,60000);
        local_68 = local_68 + dVar9;
        dVar9 = Hashrate::calc(this_00,900000);
        local_60 = local_60 + dVar9;
      }
      (*pIVar2->_vptr_IBackend[8])(pIVar2,details);
      ppIVar8 = ppIVar8 + 1;
    } while (ppIVar8 != ppIVar1);
  }
  pcVar4 = Hashrate::format(local_70,local_58,8);
  pcVar5 = Hashrate::format(local_68,local_58 + 8,8);
  pcVar6 = Hashrate::format(local_60,local_58 + 0x10,8);
  pcVar7 = Hashrate::format(this->d_ptr->maxHashrate,local_58 + 0x18,8);
  Log::print(INFO,
             "\x1b[1;37mspeed\x1b[0m 10s/60s/15m \x1b[1;36m%s\x1b[0m\x1b[0;36m %s %s \x1b[0m\x1b[1;36mH/s\x1b[0m max \x1b[1;36m%s H/s\x1b[0m"
             ,pcVar4,pcVar5,pcVar6,pcVar7);
  return;
}

Assistant:

void xmrig::Miner::printHashrate(bool details)
{
    char num[8 * 4] = { 0 };
    double speed[3] = { 0.0 };

    for (IBackend *backend : d_ptr->backends) {
        const Hashrate *hashrate = backend->hashrate();
        if (hashrate) {
            speed[0] += hashrate->calc(Hashrate::ShortInterval);
            speed[1] += hashrate->calc(Hashrate::MediumInterval);
            speed[2] += hashrate->calc(Hashrate::LargeInterval);
        }

        backend->printHashrate(details);
    }

    LOG_INFO(WHITE_BOLD("speed") " 10s/60s/15m " CYAN_BOLD("%s") CYAN(" %s %s ") CYAN_BOLD("H/s") " max " CYAN_BOLD("%s H/s"),
             Hashrate::format(speed[0],                                 num,         sizeof(num) / 4),
             Hashrate::format(speed[1],                                 num + 8,     sizeof(num) / 4),
             Hashrate::format(speed[2],                                 num + 8 * 2, sizeof(num) / 4 ),
             Hashrate::format(d_ptr->maxHashrate,     num + 8 * 3, sizeof(num) / 4)
             );
}